

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O2

void __thiscall
duckdb::QueryRelation::QueryRelation
          (QueryRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,
          unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
          *select_stmt_p,string *alias_p,string *query_p)

{
  pointer pSVar1;
  string local_50 [32];
  
  Relation::Relation(&this->super_Relation,context,QUERY_RELATION);
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__QueryRelation_027c0f60;
  (this->select_stmt).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       (select_stmt_p->
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (select_stmt_p->
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  ::std::__cxx11::string::string((string *)&this->query,(string *)query_p);
  ::std::__cxx11::string::string((string *)&this->alias,(string *)alias_p);
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->query)._M_string_length == 0) {
    pSVar1 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->select_stmt);
    (*(pSVar1->super_SQLStatement)._vptr_SQLStatement[2])(local_50,pSVar1);
    ::std::__cxx11::string::operator=((string *)&this->query,local_50);
    ::std::__cxx11::string::~string(local_50);
  }
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

QueryRelation::QueryRelation(const shared_ptr<ClientContext> &context, unique_ptr<SelectStatement> select_stmt_p,
                             string alias_p, const string &query_p)
    : Relation(context, RelationType::QUERY_RELATION), select_stmt(std::move(select_stmt_p)), query(query_p),
      alias(std::move(alias_p)) {
	if (query.empty()) {
		query = select_stmt->ToString();
	}
	TryBindRelation(columns);
}